

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall pbrt::MLTSampler::Reject(MLTSampler *this)

{
  size_t sVar1;
  long lVar2;
  PrimarySample *pPVar3;
  long lVar4;
  
  sVar1 = (this->X).nStored;
  lVar2 = this->currentIteration;
  if (sVar1 != 0) {
    pPVar3 = (this->X).ptr;
    lVar4 = 0;
    do {
      if (*(long *)((long)&pPVar3->lastModificationIteration + lVar4) == lVar2) {
        *(undefined4 *)((long)&pPVar3->value + lVar4) =
             *(undefined4 *)((long)&pPVar3->valueBackup + lVar4);
        *(undefined8 *)((long)&pPVar3->lastModificationIteration + lVar4) =
             *(undefined8 *)((long)&pPVar3->modifyBackup + lVar4);
      }
      lVar4 = lVar4 + 0x20;
    } while (sVar1 << 5 != lVar4);
  }
  this->currentIteration = lVar2 + -1;
  return;
}

Assistant:

PBRT_CPU_GPU
    iterator end() { return ptr + nStored; }